

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O2

void jinit_marker_writer(j_compress_ptr cinfo)

{
  jpeg_marker_writer *pjVar1;
  
  pjVar1 = (jpeg_marker_writer *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x40);
  cinfo->marker = pjVar1;
  pjVar1->write_file_header = write_file_header;
  pjVar1->write_frame_header = write_frame_header;
  pjVar1->write_scan_header = write_scan_header;
  pjVar1->write_file_trailer = write_file_trailer;
  pjVar1->write_tables_only = write_tables_only;
  pjVar1->write_marker_header = write_marker_header;
  pjVar1->write_marker_byte = write_marker_byte;
  *(undefined4 *)&pjVar1[1].write_file_header = 0;
  return;
}

Assistant:

GLOBAL(void)
jinit_marker_writer(j_compress_ptr cinfo)
{
  my_marker_ptr marker;

  /* Create the subobject */
  marker = (my_marker_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_marker_writer));
  cinfo->marker = (struct jpeg_marker_writer *)marker;
  /* Initialize method pointers */
  marker->pub.write_file_header = write_file_header;
  marker->pub.write_frame_header = write_frame_header;
  marker->pub.write_scan_header = write_scan_header;
  marker->pub.write_file_trailer = write_file_trailer;
  marker->pub.write_tables_only = write_tables_only;
  marker->pub.write_marker_header = write_marker_header;
  marker->pub.write_marker_byte = write_marker_byte;
  /* Initialize private state */
  marker->last_restart_interval = 0;
}